

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

void __thiscall GdlLookupExpression::GlyphAttrCheck(GdlLookupExpression *this,Symbol param_1)

{
  bool bVar1;
  string *this_00;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtGlyphData);
  if (!bVar1) {
    bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttr);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_28,
                 "Slot attribute references are not permitted in glyph attribute values",&local_a9);
      GrcErrorList::AddError
                (&g_errorList,0x83c,&(this->super_GdlExpression).super_GdlObject,&local_28);
      this_00 = &local_28;
    }
    else {
      bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtFeature);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&local_48,
                   "Feature references are not permitted in glyph attribute values",&local_a9);
        GrcErrorList::AddError
                  (&g_errorList,0x83d,&(this->super_GdlExpression).super_GdlObject,&local_48);
        this_00 = &local_48;
      }
      else {
        bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtProcState);
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&local_68,
                     "Processing-state references are not permitted in glyph attribute values",
                     &local_a9);
          GrcErrorList::AddError
                    (&g_errorList,0x83e,&(this->super_GdlExpression).super_GdlObject,&local_68);
          this_00 = &local_68;
        }
        else {
          std::__cxx11::string::string((string *)&local_88,"Unknown attribute: ",&local_a9);
          GrcSymbolTableEntry::FullName_abi_cxx11_(&local_a8,this->m_psymName);
          GrcErrorList::AddError
                    (&g_errorList,0x83f,&(this->super_GdlExpression).super_GdlObject,&local_88,
                     &local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          this_00 = &local_88;
        }
      }
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return;
}

Assistant:

void GdlLookupExpression::GlyphAttrCheck(Symbol /*psymAttr*/)
{
	if (m_psymName->FitsSymbolType(ksymtGlyphData))
	{
		//	okay
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttr))
	{
		g_errorList.AddError(2108, this,
			"Slot attribute references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtFeature))
	{
		g_errorList.AddError(2109, this,
			"Feature references are not permitted in glyph attribute values");
	}
	else if (m_psymName->FitsSymbolType(ksymtProcState))
	{
		g_errorList.AddError(2110, this,
			"Processing-state references are not permitted in glyph attribute values");
	}
	else
	{
		g_errorList.AddError(2111, this,
			"Unknown attribute: ",
			m_psymName->FullName());
	}
}